

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O3

void rtr_mgr_cb(rtr_socket *sock,rtr_socket_state state,void *data_config,void *data_group)

{
  pthread_rwlock_t *ppVar1;
  long lVar2;
  rtr_mgr_group *group;
  long lVar3;
  void *pvVar4;
  bool bVar5;
  ulong uVar6;
  long *plVar7;
  rtr_mgr_status mgr_status;
  ulong uVar8;
  ulong uVar9;
  char *frmt;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (state == RTR_SHUTDOWN) {
    lrtr_dbg("RTR_MGR: Received RTR_SHUTDOWN callback");
  }
  if (data_group == (void *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      frmt = "RTR_MGR: ERROR: Socket has no group";
LAB_00106c3a:
      lrtr_dbg(frmt);
      return;
    }
    goto LAB_00106e7b;
  }
  switch(state) {
  case RTR_CONNECTING:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00106e7b;
    mgr_status = (uint)(*(int *)((long)data_group + 0x10) == 3) * 2 + RTR_MGR_CONNECTING;
    goto LAB_00106cb4;
  case RTR_ESTABLISHED:
    if (*(int *)((long)data_group + 0x10) != 3) {
      if (*(int *)((long)data_group + 0x10) != 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          return;
        }
        goto LAB_00106e7b;
      }
      uVar8 = (ulong)*(uint *)((long)data_group + 8);
      if (uVar8 != 0) {
        lVar3 = **data_group;
        if ((*(long *)(lVar3 + 0x10) != 0) && (0xfffffffc < *(int *)(lVar3 + 0x24) - 4U)) {
          uVar6 = 1;
          do {
            uVar9 = uVar6;
            if ((uVar8 == uVar9) || (lVar3 = (*data_group)[uVar9], *(long *)(lVar3 + 0x10) == 0))
            break;
            uVar6 = uVar9 + 1;
          } while (0xfffffffc < *(int *)(lVar3 + 0x24) - 4U);
          if (uVar8 <= uVar9) goto LAB_00106e41;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00106e7b;
        mgr_status = RTR_MGR_CONNECTING;
        goto LAB_00106cb4;
      }
LAB_00106e41:
      set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,RTR_MGR_ESTABLISHED,sock)
      ;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        rtr_mgr_close_less_preferable_groups
                  (sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
        return;
      }
      goto LAB_00106e7b;
    }
    ppVar1 = (pthread_rwlock_t *)((long)data_config + 0x10);
    pthread_rwlock_rdlock(ppVar1);
    plVar7 = (long *)**data_config;
    if (plVar7 == (long *)0x0) {
      pthread_rwlock_unlock(ppVar1);
LAB_00106dd5:
      uVar8 = (ulong)*(uint *)((long)data_group + 8);
      if (uVar8 == 0) goto LAB_00106e41;
      lVar3 = **data_group;
      if ((*(long *)(lVar3 + 0x10) != 0) && (0xfffffffc < *(int *)(lVar3 + 0x24) - 4U)) {
        uVar6 = 1;
        do {
          uVar9 = uVar6;
          if ((uVar8 == uVar9) || (lVar3 = (*data_group)[uVar9], *(long *)(lVar3 + 0x10) == 0))
          break;
          uVar6 = uVar9 + 1;
        } while (0xfffffffc < *(int *)(lVar3 + 0x24) - 4U);
        if (uVar8 <= uVar9) goto LAB_00106e41;
      }
    }
    else {
      bVar5 = true;
      do {
        pvVar4 = *(void **)(plVar7[2] + 0x20);
        if (((pvVar4 != data_group) && (*(int *)((long)pvVar4 + 0x10) != 0)) &&
           (*(int *)((long)pvVar4 + 0x10) != 3)) {
          bVar5 = (bool)(bVar5 & *(byte *)((long)data_group + 0xc) <= *(byte *)((long)pvVar4 + 0xc))
          ;
        }
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
      pthread_rwlock_unlock(ppVar1);
      if (bVar5) goto LAB_00106dd5;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00106e7b;
    mgr_status = RTR_MGR_ERROR;
    goto LAB_00106cb4;
  default:
switchD_00106b36_caseD_2:
    mgr_status = *(rtr_mgr_status *)((long)data_group + 0x10);
    break;
  case RTR_ERROR_NO_DATA_AVAIL:
  case RTR_ERROR_FATAL:
  case RTR_ERROR_TRANSPORT:
    set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,RTR_MGR_ERROR,sock);
    ppVar1 = (pthread_rwlock_t *)((long)data_config + 0x10);
    pthread_rwlock_rdlock(ppVar1);
    plVar7 = *data_config;
    do {
      plVar7 = (long *)*plVar7;
      if (plVar7 == (long *)0x0) {
        pthread_rwlock_unlock(ppVar1);
        pthread_rwlock_rdlock(ppVar1);
        plVar7 = *data_config;
        goto LAB_00106bcb;
      }
    } while (*(int *)(*(long *)(plVar7[2] + 0x20) + 0x10) != 2);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_rwlock_unlock(ppVar1);
      return;
    }
    goto LAB_00106e7b;
  case RTR_SHUTDOWN:
    if ((ulong)*(uint *)((long)data_group + 8) != 0) {
      uVar8 = 0;
      do {
        if (*(int *)(*(long *)(*data_group + uVar8 * 8) + 0x24) != 9) goto switchD_00106b36_caseD_2;
        uVar8 = uVar8 + 1;
      } while (*(uint *)((long)data_group + 8) != uVar8);
    }
    mgr_status = RTR_MGR_CLOSED;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_00106e7b:
    __stack_chk_fail();
  }
LAB_00106cb4:
  set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,mgr_status,sock);
  return;
  while ((group = *(rtr_mgr_group **)(plVar7[2] + 0x20), group == (rtr_mgr_group *)data_group ||
         (group->status != RTR_MGR_CLOSED))) {
LAB_00106bcb:
    plVar7 = (long *)*plVar7;
    if (plVar7 == (long *)0x0) {
      pthread_rwlock_unlock(ppVar1);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00106e7b;
      frmt = "RTR_MGR: No other inactive groups found";
      goto LAB_00106c3a;
    }
  }
  pthread_rwlock_unlock(ppVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    rtr_mgr_start_sockets(group);
    return;
  }
  goto LAB_00106e7b;
}

Assistant:

static void rtr_mgr_cb(const struct rtr_socket *sock, const enum rtr_socket_state state, void *data_config,
		       void *data_group)
{
	if (state == RTR_SHUTDOWN)
		MGR_DBG1("Received RTR_SHUTDOWN callback");

	struct rtr_mgr_config *config = data_config;
	struct rtr_mgr_group *group = data_group;

	if (!group) {
		MGR_DBG1("ERROR: Socket has no group");
		return;
	}

	switch (state) {
	case RTR_SHUTDOWN:
		_rtr_mgr_cb_state_shutdown(sock, config, group);
		break;
	case RTR_ESTABLISHED:
		_rtr_mgr_cb_state_established(sock, config, group);
		break;
	case RTR_CONNECTING:
		_rtr_mgr_cb_state_connecting(sock, config, group);
		break;
	case RTR_ERROR_FATAL:
	case RTR_ERROR_TRANSPORT:
	case RTR_ERROR_NO_DATA_AVAIL:
		_rtr_mgr_cb_state_error(sock, config, group);
		break;
	default:
		set_status(config, group, group->status, sock);
	}
}